

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-lib.cpp
# Opt level: O2

void __thiscall LibClass::doSomething(LibClass *this)

{
  LibInternalClass *this_00;
  int iVar1;
  bool bVar2;
  
  iVar1 = 0x14;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    this_00 = (LibInternalClass *)operator_new(8);
    LibInternalClass::LibInternalClass(this_00);
  }
  return;
}

Assistant:

void LibClass::doSomething() {
    for (int i = 0; i < 20; i++) {
        LibInternalClass* temp = new LibInternalClass();
    }
}